

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::Dummy(ImVec2 *size)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  float fVar3;
  ImRect bb;
  ImVec2 local_20;
  ImRect local_18;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    fVar2 = (pIVar1->DC).CursorPos.x + size->x;
    fVar3 = (pIVar1->DC).CursorPos.y + size->y;
    local_18.Min = (pIVar1->DC).CursorPos;
    local_18.Max.y = fVar3;
    local_18.Max.x = fVar2;
    local_20.y = fVar3 - local_18.Min.y;
    local_20.x = fVar2 - local_18.Min.x;
    ItemSize(&local_20,0.0);
    ItemAdd(&local_18,(ImGuiID *)0x0);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }